

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O3

void jit_profile_callback(lua_State *L2,lua_State *L,int samples,int vmstate)

{
  byte *pbVar1;
  TValue *pTVar2;
  code *pcVar3;
  int iVar4;
  cTValue *pcVar5;
  GCstr *pGVar6;
  ulong uVar7;
  char vmst;
  TValue key;
  char local_29;
  cTValue local_28;
  
  local_28.n = -5.03946958758071e-322;
  pcVar5 = lj_tab_get(L,(GCtab *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0x118),&local_28);
  if ((pcVar5->field_2).it == 0xfffffff7) {
    local_29 = (char)vmstate;
    pTVar2 = L2->top;
    L2->top = pTVar2 + 1;
    (pTVar2->field_2).field_0 = (pcVar5->field_2).field_0;
    (pTVar2->field_2).it = 0xfffffff7;
    pTVar2 = L2->top;
    L2->top = pTVar2 + 1;
    (pTVar2->u32).lo = (uint32_t)L;
    (pTVar2->field_2).it = 0xfffffff9;
    pTVar2 = L2->top;
    L2->top = pTVar2 + 1;
    pTVar2->n = (double)samples;
    pTVar2 = L2->top;
    L2->top = pTVar2 + 1;
    pGVar6 = lj_str_new(L2,&local_29,1);
    (pTVar2->u32).lo = (uint32_t)pGVar6;
    (pTVar2->field_2).it = 0xfffffffb;
    iVar4 = lua_pcall(L2,3,0,0);
    uVar7 = (ulong)(L2->glref).ptr32;
    if (iVar4 != 0) {
      pcVar3 = *(code **)(uVar7 + 0x178);
      if (pcVar3 != (code *)0x0) {
        (*pcVar3)(L2);
      }
      exit(1);
    }
    pbVar1 = (byte *)(uVar7 + 0x31c);
    *pbVar1 = *pbVar1 & 0xef;
  }
  return;
}

Assistant:

static void jit_profile_callback(lua_State *L2, lua_State *L, int samples,
				 int vmstate)
{
  TValue key;
  cTValue *tv;
  key.u64 = KEY_PROFILE_FUNC;
  tv = lj_tab_get(L, tabV(registry(L)), &key);
  if (tvisfunc(tv)) {
    char vmst = (char)vmstate;
    int status;
    setfuncV(L2, L2->top++, funcV(tv));
    setthreadV(L2, L2->top++, L);
    setintV(L2->top++, samples);
    setstrV(L2, L2->top++, lj_str_new(L2, &vmst, 1));
    status = lua_pcall(L2, 3, 0, 0);  /* callback(thread, samples, vmstate) */
    if (status) {
      if (G(L2)->panic) G(L2)->panic(L2);
      exit(EXIT_FAILURE);
    }
    lj_trace_abort(G(L2));
  }
}